

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_input.cpp
# Opt level: O0

InputMap * Omega_h::read_input_without_includes(InputMap *__return_storage_ptr__,path *path)

{
  byte bVar1;
  value_type_conflict *pvVar2;
  InputMap *other;
  path local_400;
  undefined1 local_3e0 [8];
  any result_any;
  InputYamlReader reader;
  istream local_220 [8];
  ifstream stream;
  path *path_local;
  
  pvVar2 = filesystem::path::c_str(path);
  std::ifstream::ifstream(local_220,pvVar2,_S_in);
  bVar1 = std::ifstream::is_open();
  if ((bVar1 & 1) == 0) {
    pvVar2 = filesystem::path::c_str(path);
    fail("Couldn\'t open Input file \"%s\"\n",pvVar2);
  }
  InputYamlReader::InputYamlReader((InputYamlReader *)&result_any.vtable);
  filesystem::path::string_abi_cxx11_(&local_400);
  Reader::read_stream((any *)local_3e0,(Reader *)&result_any.vtable,local_220,&local_400.impl);
  std::__cxx11::string::~string((string *)&local_400);
  other = any_cast<Omega_h::InputMap&&>((any *)local_3e0);
  InputMap::InputMap(__return_storage_ptr__,other);
  any::~any((any *)local_3e0);
  InputYamlReader::~InputYamlReader((InputYamlReader *)&result_any.vtable);
  std::ifstream::~ifstream(local_220);
  return __return_storage_ptr__;
}

Assistant:

static InputMap read_input_without_includes(
    Omega_h::filesystem::path const& path) {
  std::ifstream stream(path.c_str());
  if (!stream.is_open()) {
    Omega_h_fail("Couldn't open Input file \"%s\"\n", path.c_str());
  }
  Omega_h::InputYamlReader reader;
  auto result_any = reader.read_stream(stream, path.string());
  return any_cast<InputMap&&>(std::move(result_any));
}